

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O0

bool __thiscall QPathEdit::setPath(QPathEdit *this,QString *path,bool allowInvalid)

{
  bool bVar1;
  int iVar2;
  QString *pQVar3;
  QString local_100;
  QArrayDataPointer<char16_t> local_e8;
  QString local_d0;
  QArrayDataPointer<char16_t> local_a8;
  QString local_90;
  undefined4 local_74;
  undefined1 local_70 [4];
  int pseudo;
  byte local_51;
  QString *pQStack_50;
  bool allowInvalid_local;
  QString *path_local;
  QPathEdit *this_local;
  char16_t *local_38;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  local_51 = allowInvalid;
  pQStack_50 = path;
  path_local = (QString *)this;
  QLineEdit::text();
  bVar1 = ::operator==((QString *)local_70,path);
  QString::~QString((QString *)local_70);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    if ((local_51 & 1) != 0) {
      QLineEdit::setText((QString *)this->edit);
    }
    local_74 = 0;
    iVar2 = (**(code **)(*(long *)this->pathValidator + 0x60))(this->pathValidator,path,&local_74);
    if (iVar2 == 2) {
      str = L"\\";
      local_20 = L"\\";
      local_10 = &local_a8;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_a8,(Data *)0x0,L"\\",1);
      QString::QString(&local_90,&local_a8);
      local_28 = &local_e8;
      str_1 = L"/";
      local_38 = L"/";
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_e8,(Data *)0x0,L"/",1);
      QString::QString(&local_d0,&local_e8);
      pQVar3 = (QString *)QString::replace(path,&local_90,(CaseSensitivity)&local_d0);
      QString::operator=(&this->currentValidPath,pQVar3);
      QString::~QString(&local_d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      QString::~QString(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      if ((local_51 & 1) == 0) {
        QLineEdit::setText((QString *)this->edit);
      }
      QString::QString(&local_100,path);
      pathChanged(this,&local_100);
      QString::~QString(&local_100);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool QPathEdit::setPath(QString path, bool allowInvalid) {
    if (edit->text() == path) {
		return true;
    }

    if(allowInvalid) {
		edit->setText(path);
    }

	int pseudo = 0;
	if(pathValidator->validate(path, pseudo) == QValidator::Acceptable) {
		currentValidPath = path.replace(QStringLiteral("\\"), QStringLiteral("/"));
        if(!allowInvalid) {
			edit->setText(path);
        }
		emit pathChanged(path);
		return true;
    } else {
		return false;
    }
}